

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

QModelIndex * __thiscall
QCompletionModel::mapToSource
          (QModelIndex *__return_storage_ptr__,QCompletionModel *this,QModelIndex *index)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  QCompletionEngine *pQVar5;
  long *plVar6;
  quintptr qVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined8 local_48;
  quintptr qStack_40;
  QAbstractItemModel *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = index->r;
  uVar11 = (ulong)iVar3;
  if ((((long)uVar11 < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) {
    pQVar5 = (this->engine).d;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      (__return_storage_ptr__->m).ptr = (pQVar5->curParent).m.ptr;
      iVar3 = (pQVar5->curParent).c;
      qVar7 = (pQVar5->curParent).i;
      __return_storage_ptr__->r = (pQVar5->curParent).r;
      __return_storage_ptr__->c = iVar3;
      __return_storage_ptr__->i = qVar7;
      return __return_storage_ptr__;
    }
  }
  else {
    lVar4 = *(long *)&this->field_0x8;
    pQVar5 = (this->engine).d;
    local_38 = (pQVar5->curParent).m.ptr;
    local_48._0_4_ = (pQVar5->curParent).r;
    local_48._4_4_ = (pQVar5->curParent).c;
    qStack_40 = (pQVar5->curParent).i;
    if (this->showAll == false) {
      bVar1 = (pQVar5->curMatch).indices.v;
      if (bVar1 == true) {
        iVar9 = (int)(pQVar5->curMatch).indices.vector.d.size;
      }
      else {
        iVar9 = ((pQVar5->curMatch).indices.t - (pQVar5->curMatch).indices.f) + 1;
      }
      bVar2 = (pQVar5->historyMatch).indices.v;
      if (bVar2 == true) {
        iVar10 = (int)(pQVar5->historyMatch).indices.vector.d.size;
      }
      else {
        iVar10 = ((pQVar5->historyMatch).indices.t - (pQVar5->historyMatch).indices.f) + 1;
      }
      if (iVar10 + iVar9 == 0) {
        __return_storage_ptr__->r = -1;
        __return_storage_ptr__->c = -1;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __return_storage_ptr__->i = 0;
          (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
          return __return_storage_ptr__;
        }
        goto LAB_006568d8;
      }
      if (bVar2 == false) {
        iVar9 = ((pQVar5->historyMatch).indices.t - (pQVar5->historyMatch).indices.f) + 1;
      }
      else {
        iVar9 = (int)(pQVar5->historyMatch).indices.vector.d.size;
      }
      if (iVar3 < iVar9) {
        if (bVar2 == false) {
          uVar8 = (pQVar5->historyMatch).indices.f + iVar3;
        }
        else {
          uVar8 = (pQVar5->historyMatch).indices.vector.d.ptr[uVar11];
        }
        uVar11 = (ulong)uVar8;
        qStack_40 = 0;
        local_38 = (QAbstractItemModel *)0x0;
        local_48 = 0xffffffffffffffff;
      }
      else {
        if (bVar2 == false) {
          iVar9 = ((pQVar5->historyMatch).indices.t - (pQVar5->historyMatch).indices.f) + 1;
        }
        else {
          iVar9 = (int)(pQVar5->historyMatch).indices.vector.d.size;
        }
        if (bVar1 == false) {
          uVar11 = (ulong)(uint)((iVar3 - iVar9) + (pQVar5->curMatch).indices.f);
        }
        else {
          uVar11 = (ulong)(uint)(pQVar5->curMatch).indices.vector.d.ptr[iVar3 - iVar9];
        }
      }
    }
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(lVar4 + 0xd8));
    plVar6 = *(long **)(lVar4 + 0xd8);
    (**(code **)(*plVar6 + 0x60))
              (__return_storage_ptr__,plVar6,uVar11 & 0xffffffff,index->c,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
LAB_006568d8:
  __stack_chk_fail();
}

Assistant:

QModelIndex QCompletionModel::mapToSource(const QModelIndex& index) const
{
    Q_D(const QCompletionModel);
    if (!index.isValid())
        return engine->curParent;

    int row;
    QModelIndex parent = engine->curParent;
    if (!showAll) {
        if (!engine->matchCount())
            return QModelIndex();
        Q_ASSERT(index.row() < engine->matchCount());
        QIndexMapper& rootIndices = engine->historyMatch.indices;
        if (index.row() < rootIndices.count()) {
            row = rootIndices[index.row()];
            parent = QModelIndex();
        } else {
            row = engine->curMatch.indices[index.row() - rootIndices.count()];
        }
    } else {
        row = index.row();
    }

    return d->model->index(row, index.column(), parent);
}